

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_bd1b::testScanLineImage(Box2i *dataWindow,string *fileName)

{
  Vec2<int> *pVVar1;
  ostream *poVar2;
  Rand48 random;
  FlatImage img2;
  FlatImage img1;
  Rand48 local_f6;
  FlatImage local_f0;
  Image local_88;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"scan lines, data window = (",0x1b);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - (",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  Imf_2_5::FlatImage::FlatImage((FlatImage *)&local_88);
  Imf_2_5::Image::resize(&local_88,dataWindow);
  pVVar1 = &local_f0.super_Image._dataWindow.max;
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"H11","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,HALF,1,1,false);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"H22","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,HALF,2,2,true);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"H12","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,HALF,1,2,true);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"H21","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,HALF,2,1,true);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"F","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,FLOAT,1,1,false);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f0.super_Image._vptr_Image = (_func_int **)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"UI","");
  Imf_2_5::Image::insertChannel(&local_88,(string *)&local_f0,UINT,1,1,false);
  if ((Vec2<int> *)local_f0.super_Image._vptr_Image != pVVar1) {
    operator_delete(local_f0.super_Image._vptr_Image,(long)local_f0.super_Image._dataWindow.max + 1)
    ;
  }
  local_f6._state[0] = 0x5a5a;
  local_f6._state[1] = 0x5a5a;
  local_f6._state[2] = 0x5a5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  fillChannels(&local_f6,(FlatImage *)&local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    saving file",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  Imf_2_5::saveFlatScanLineImage(fileName,(FlatImage *)&local_88);
  Imf_2_5::FlatImage::FlatImage(&local_f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  Imf_2_5::loadFlatImage(fileName,&local_f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  verifyImagesAreEqual((FlatImage *)&local_88,&local_f0,0,0);
  remove((fileName->_M_dataplus)._M_p);
  Imf_2_5::FlatImage::~FlatImage(&local_f0);
  Imf_2_5::FlatImage::~FlatImage((FlatImage *)&local_88);
  return;
}

Assistant:

void
testScanLineImage
    (const Box2i &dataWindow,
     const string &fileName)
{
    cout << "scan lines, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img1;
    img1.resize (dataWindow);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveDeepScanLineImage (fileName, img1);
    
    DeepImage img2;

    cout << "    loading file" << endl;
    loadDeepImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str());
}